

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

size_t __thiscall
booster::locale::impl_icu::date_format<char>::do_parse<long>
          (date_format<char> *this,string_type *str,long *value)

{
  char_type *begin;
  size_t sVar1;
  double dVar2;
  ParsePosition pp;
  UnicodeString tmp;
  code *local_88;
  undefined8 local_80;
  double local_78;
  icu_std_converter<char,_1> local_60;
  
  local_88 = std::_Rb_tree_increment;
  local_80 = 0xffffffff00000000;
  icu_std_converter<char,_1>::icu(&local_60,(char_type *)&this->cvt_,(str->_M_dataplus)._M_p);
  dVar2 = (double)icu_70::DateFormat::parse
                            ((UnicodeString *)this->icu_fmt_,(ParsePosition *)&local_60);
  if (((long)(int)local_80 != 0) && (ABS(dVar2 / 1000.0) <= 9.223372036854776e+18)) {
    begin = (str->_M_dataplus)._M_p;
    local_78 = dVar2 / 1000.0;
    sVar1 = icu_std_converter<char,_1>::cut
                      (&this->cvt_,(UnicodeString *)&local_60,begin,begin + str->_M_string_length,
                       (long)(int)local_80,0,0);
    if (sVar1 != 0) {
      *value = (long)local_78;
      goto LAB_0019328e;
    }
  }
  sVar1 = 0;
LAB_0019328e:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_60);
  icu_70::ParsePosition::~ParsePosition((ParsePosition *)&local_88);
  return sVar1;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &value) const
            {
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data() + str.size());

                UDate udate = icu_fmt_->parse(tmp,pp);
                if(pp.getIndex() == 0)
                    return 0;
                double date = udate / 1000.0;
                typedef std::numeric_limits<ValueType> limits_type;
                if(date > limits_type::max() || date < limits_type::min())
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                value=static_cast<ValueType>(date);
                return cut;

            }